

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::extreme_value_dist<float>::pdf(extreme_value_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  float fVar3;
  double dVar4;
  
  rVar1 = param_type::eta(in_RDI);
  rVar2 = param_type::theta(in_RDI);
  fVar3 = (in_XMM0_Da - rVar1) / rVar2;
  dVar4 = std::exp((double)(ulong)(uint)fVar3);
  dVar4 = std::exp((double)(ulong)(uint)(fVar3 - SUB84(dVar4,0)));
  rVar1 = param_type::theta(in_RDI);
  return SUB84(dVar4,0) / rVar1;
}

Assistant:

pdf(result_type x) const {
      x -= P.eta();
      x /= P.theta();
      return math::exp(x - math::exp(x)) / P.theta();
    }